

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image.h
# Opt level: O0

void * __thiscall pbrt::Image::RawPointer(Image *this,Point2i p)

{
  bool bVar1;
  const_pointer puVar2;
  Tuple2<pbrt::Point2,_int> p_00;
  size_t sVar3;
  const_pointer pHVar4;
  char (*in_RSI) [16];
  PixelFormat *in_RDI;
  int unaff_retaddr;
  char *in_stack_00000008;
  LogLevel in_stack_00000014;
  Image *in_stack_ffffffffffffffa8;
  Tuple2<pbrt::Point2,_int> in_stack_ffffffffffffffb0;
  char *in_stack_fffffffffffffff8;
  
  bVar1 = Is8Bit(*in_RDI);
  if (bVar1) {
    puVar2 = pstd::vector<unsigned_char,_pstd::pmr::polymorphic_allocator<unsigned_char>_>::data
                       ((vector<unsigned_char,_pstd::pmr::polymorphic_allocator<unsigned_char>_> *)
                        (in_RDI + 0xe));
    sVar3 = PixelOffset(in_stack_ffffffffffffffa8,(Point2i)in_stack_ffffffffffffffb0);
    pHVar4 = (const_pointer)(puVar2 + sVar3);
  }
  else {
    bVar1 = Is16Bit(*in_RDI);
    if (bVar1) {
      pHVar4 = pstd::vector<pbrt::Half,_pstd::pmr::polymorphic_allocator<pbrt::Half>_>::data
                         ((vector<pbrt::Half,_pstd::pmr::polymorphic_allocator<pbrt::Half>_> *)
                          (in_RDI + 0x16));
      sVar3 = PixelOffset(in_stack_ffffffffffffffa8,(Point2i)in_stack_ffffffffffffffb0);
      pHVar4 = pHVar4 + sVar3;
    }
    else {
      bVar1 = Is32Bit(*in_RDI);
      if (!bVar1) {
        LogFatal<char_const(&)[16]>
                  (in_stack_00000014,in_stack_00000008,unaff_retaddr,in_stack_fffffffffffffff8,
                   in_RSI);
      }
      p_00 = (Tuple2<pbrt::Point2,_int>)
             pstd::vector<float,_pstd::pmr::polymorphic_allocator<float>_>::data
                       ((vector<float,_pstd::pmr::polymorphic_allocator<float>_> *)(in_RDI + 0x1e));
      sVar3 = PixelOffset(in_stack_ffffffffffffffa8,(Point2i)p_00);
      pHVar4 = (const_pointer)((long)p_00 + sVar3 * 4);
    }
  }
  return pHVar4;
}

Assistant:

PBRT_CPU_GPU
    const void *RawPointer(Point2i p) const {
        if (Is8Bit(format))
            return p8.data() + PixelOffset(p);
        if (Is16Bit(format))
            return p16.data() + PixelOffset(p);
        else {
            CHECK(Is32Bit(format));
            return p32.data() + PixelOffset(p);
        }
    }